

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithQueryDepsLogTest::BuildWithQueryDepsLogTest(BuildWithQueryDepsLogTest *this)

{
  BuildWithQueryDepsLogTest *this_local;
  
  (this->super_BuildTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__BuildWithQueryDepsLogTest_002a3950;
  (this->super_BuildTest).super_BuildLogUser._vptr_BuildLogUser = (_func_int **)&DAT_002a3990;
  BuildTest::BuildTest(&this->super_BuildTest,&this->log_);
  (this->super_BuildTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__BuildWithQueryDepsLogTest_002a3950;
  (this->super_BuildTest).super_BuildLogUser._vptr_BuildLogUser = (_func_int **)&DAT_002a3990;
  ScopedTempDir::ScopedTempDir(&this->temp_dir_);
  DepsLog::DepsLog(&this->log_);
  return;
}

Assistant:

BuildWithQueryDepsLogTest() : BuildTest(&log_) {
  }